

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basics.cpp
# Opt level: O2

void parallel_runs(uint w)

{
  code *pcVar1;
  double dVar2;
  pointer ptVar3;
  pointer ptVar4;
  char extraout_AL;
  char extraout_AL_00;
  size_type sVar5;
  pointer ptVar6;
  thread *ptVar7;
  anon_class_16_2_65e19626_for__M_head_impl *extraout_RDX;
  anon_class_16_2_65e19626_for__M_head_impl *__args;
  anon_class_16_2_65e19626_for__M_head_impl *extraout_RDX_00;
  anon_class_16_2_65e19626_for__M_head_impl *__args_00;
  anon_class_16_2_65e19626_for__M_head_impl *extraout_RDX_01;
  anon_class_40_5_6a14f4ba_for__M_head_impl *extraout_RDX_02;
  anon_class_40_5_6a14f4ba_for__M_head_impl *extraout_RDX_03;
  anon_class_40_5_6a14f4ba_for__M_head_impl *__args_01;
  anon_class_40_5_6a14f4ba_for__M_head_impl *extraout_RDX_04;
  anon_class_40_5_6a14f4ba_for__M_head_impl *__args_02;
  thread *t;
  pointer ptVar8;
  vector<std::thread,_std::allocator<std::thread>_> *__range2;
  int iVar9;
  bool bVar10;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  atomic<int> counter;
  atomic<unsigned_long> barrier;
  anon_class_8_1_bc7188dc make_taskflow;
  ResultBuilder DOCTEST_RB;
  Result local_208;
  int local_1e4;
  vector<std::unique_ptr<tf::Taskflow,_std::default_delete<tf::Taskflow>_>,_std::allocator<std::unique_ptr<tf::Taskflow,_std::default_delete<tf::Taskflow>_>_>_>
  taskflows;
  shared_ptr<tf::WorkerInterface> local_1c8;
  shared_ptr<tf::WorkerInterface> local_1b8;
  Subcase local_1a0;
  ulong local_170;
  Executor executor;
  
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  make_taskflow.counter = &counter;
  doctest::String::String((String *)&executor,"RunAndWait");
  doctest::detail::Subcase::Subcase
            (&local_1a0,(String *)&executor,
             "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_basics.cpp"
             ,0x328);
  doctest::String::~String((String *)&executor);
  if (local_1a0.m_entered == true) {
    local_1b8.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_1b8.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    tf::Executor::Executor(&executor,(ulong)w,&local_1b8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_1b8.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    LOCK();
    counter.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
    UNLOCK();
    iVar9 = 0x20;
    __args = extraout_RDX;
    while( true ) {
      ptVar3 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_finish;
      bVar10 = iVar9 == 0;
      iVar9 = iVar9 + -1;
      ptVar8 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (bVar10) break;
      DOCTEST_RB.super_AssertData.m_test_case = (TestCaseData *)&make_taskflow;
      DOCTEST_RB.super_AssertData._8_8_ = &executor;
      if (threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        sVar5 = std::vector<std::thread,_std::allocator<std::thread>_>::_M_check_len
                          (&threads,1,"vector::_M_realloc_insert");
        ptVar4 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        ptVar8 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_start;
        ptVar6 = std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_allocate
                           (&threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>,
                            sVar5);
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,parallel_runs(unsigned_int)::__1>
                  ((allocator_type *)(((long)ptVar3 - (long)ptVar8) + (long)ptVar6),
                   (thread *)&DOCTEST_RB,__args_00);
        ptVar7 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                           (ptVar8,ptVar3,ptVar6,(allocator<std::thread> *)&threads);
        ptVar7 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                           (ptVar3,ptVar4,ptVar7 + 1,(allocator<std::thread> *)&threads);
        std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_deallocate
                  (&threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>,ptVar8,
                   (long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ptVar8 >> 3);
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = ptVar6 + sVar5;
        __args = extraout_RDX_01;
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start = ptVar6;
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish = ptVar7;
      }
      else {
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,parallel_runs(unsigned_int)::__1>
                  ((allocator_type *)
                   threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                   super__Vector_impl_data._M_finish,(thread *)&DOCTEST_RB,__args);
        __args = extraout_RDX_00;
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish =
             threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
    }
    while( true ) {
      if (ptVar8 == ptVar3) break;
      std::thread::join();
      ptVar8 = ptVar8 + 1;
    }
    std::vector<std::thread,_std::allocator<std::thread>_>::clear(&threads);
    DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
    DOCTEST_RB.super_AssertData._71_2_ = 0x17;
    DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE;
    DOCTEST_RB.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_basics.cpp"
    ;
    DOCTEST_RB.super_AssertData.m_line = 0x338;
    DOCTEST_RB.super_AssertData.m_expr = "counter.load() == 32*1024*2";
    DOCTEST_RB.super_AssertData.m_failed = true;
    DOCTEST_RB.super_AssertData.m_threw = false;
    DOCTEST_RB.super_AssertData.m_threw_as = false;
    DOCTEST_RB.super_AssertData.m_exception_type = "";
    DOCTEST_RB.super_AssertData.m_exception_string = "";
    taskflows.
    super__Vector_base<std::unique_ptr<tf::Taskflow,_std::default_delete<tf::Taskflow>_>,_std::allocator<std::unique_ptr<tf::Taskflow,_std::default_delete<tf::Taskflow>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)((ulong)(uint)counter.super___atomic_base<int>._M_i | 0xc00000000);
    barrier.super___atomic_base<unsigned_long>._M_i._0_4_ = 0x10000;
    doctest::detail::Expression_lhs<int_const>::operator==
              (&local_208,(Expression_lhs<int_const> *)&taskflows,(int *)&barrier);
    doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_208);
    doctest::String::~String(&local_208.m_decomp);
    dVar2 = doctest::detail::ResultBuilder::log
                      (&DOCTEST_RB,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    if (extraout_AL != '\0') {
      pcVar1 = (code *)swi(3);
      (*pcVar1)(SUB84(dVar2,0));
      return;
    }
    doctest::detail::ResultBuilder::react(&DOCTEST_RB);
    doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
    tf::Executor::~Executor(&executor);
  }
  doctest::detail::Subcase::~Subcase(&local_1a0);
  doctest::String::String((String *)&executor,"RunAndWaitForAll");
  doctest::detail::Subcase::Subcase
            (&local_1a0,(String *)&executor,
             "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_basics.cpp"
             ,0x33c);
  doctest::String::~String((String *)&executor);
  if (local_1a0.m_entered == true) {
    local_1c8.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_1c8.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    tf::Executor::Executor(&executor,(ulong)w,&local_1c8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_1c8.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    iVar9 = 0;
    LOCK();
    counter.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
    UNLOCK();
    std::
    vector<std::unique_ptr<tf::Taskflow,_std::default_delete<tf::Taskflow>_>,_std::allocator<std::unique_ptr<tf::Taskflow,_std::default_delete<tf::Taskflow>_>_>_>
    ::vector(&taskflows,0x20,(allocator_type *)&DOCTEST_RB);
    barrier.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
    __args_02 = extraout_RDX_02;
    while( true ) {
      ptVar3 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (iVar9 == 0x20) break;
      DOCTEST_RB.super_AssertData.m_test_case =
           (TestCaseData *)CONCAT44(DOCTEST_RB.super_AssertData.m_test_case._4_4_,iVar9);
      DOCTEST_RB.super_AssertData.m_file = (char *)&make_taskflow;
      DOCTEST_RB.super_AssertData.m_expr = (char *)&barrier;
      DOCTEST_RB.super_AssertData._8_8_ = &taskflows;
      DOCTEST_RB.super_AssertData._24_8_ = &executor;
      if (threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        sVar5 = std::vector<std::thread,_std::allocator<std::thread>_>::_M_check_len
                          (&threads,1,"vector::_M_realloc_insert");
        ptVar4 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        ptVar8 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_start;
        ptVar6 = std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_allocate
                           (&threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>,
                            sVar5);
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,parallel_runs(unsigned_int)::__2>
                  ((allocator_type *)(((long)ptVar3 - (long)ptVar8) + (long)ptVar6),
                   (thread *)&DOCTEST_RB,__args_01);
        ptVar7 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                           (ptVar8,ptVar3,ptVar6,(allocator<std::thread> *)&threads);
        ptVar7 = std::__relocate_a_1<std::thread*,std::thread*,std::allocator<std::thread>>
                           (ptVar3,ptVar4,ptVar7 + 1,(allocator<std::thread> *)&threads);
        std::_Vector_base<std::thread,_std::allocator<std::thread>_>::_M_deallocate
                  (&threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>,ptVar8,
                   (long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ptVar8 >> 3);
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = ptVar6 + sVar5;
        __args_02 = extraout_RDX_04;
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start = ptVar6;
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish = ptVar7;
      }
      else {
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,parallel_runs(unsigned_int)::__2>
                  ((allocator_type *)
                   threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                   super__Vector_impl_data._M_finish,(thread *)&DOCTEST_RB,__args_02);
        __args_02 = extraout_RDX_03;
        threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish =
             threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      iVar9 = iVar9 + 1;
    }
    do {
    } while (barrier.super___atomic_base<unsigned_long>._M_i != 0x20);
    tf::Executor::wait_for_all(&executor);
    DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
    DOCTEST_RB.super_AssertData._71_2_ = 0x17;
    DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE;
    DOCTEST_RB.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_basics.cpp"
    ;
    DOCTEST_RB.super_AssertData.m_line = 0x34c;
    DOCTEST_RB.super_AssertData.m_expr = "counter.load() == 32*1024*2";
    DOCTEST_RB.super_AssertData.m_failed = true;
    DOCTEST_RB.super_AssertData.m_threw = false;
    DOCTEST_RB.super_AssertData.m_threw_as = false;
    DOCTEST_RB.super_AssertData.m_exception_type = "";
    DOCTEST_RB.super_AssertData.m_exception_string = "";
    local_170 = (ulong)(uint)counter.super___atomic_base<int>._M_i | 0xc00000000;
    local_1e4 = 0x10000;
    doctest::detail::Expression_lhs<int_const>::operator==
              (&local_208,(Expression_lhs<int_const> *)&local_170,&local_1e4);
    doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_208);
    doctest::String::~String(&local_208.m_decomp);
    dVar2 = doctest::detail::ResultBuilder::log
                      (&DOCTEST_RB,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
    if (extraout_AL_00 != '\0') {
      pcVar1 = (code *)swi(3);
      (*pcVar1)(SUB84(dVar2,0));
      return;
    }
    doctest::detail::ResultBuilder::react(&DOCTEST_RB);
    doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
    ptVar3 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (ptVar8 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_start; ptVar8 != ptVar3; ptVar8 = ptVar8 + 1) {
      std::thread::join();
    }
    std::vector<std::thread,_std::allocator<std::thread>_>::clear(&threads);
    std::
    vector<std::unique_ptr<tf::Taskflow,_std::default_delete<tf::Taskflow>_>,_std::allocator<std::unique_ptr<tf::Taskflow,_std::default_delete<tf::Taskflow>_>_>_>
    ::~vector(&taskflows);
    tf::Executor::~Executor(&executor);
  }
  doctest::detail::Subcase::~Subcase(&local_1a0);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&threads);
  return;
}

Assistant:

void parallel_runs(unsigned w) {

  std::atomic<int> counter;
  std::vector<std::thread> threads;

  auto make_taskflow = [&] (tf::Taskflow& tf) {
    for(int i=0; i<1024; i++) {
      auto A = tf.emplace([&] () {
        counter.fetch_add(1, std::memory_order_relaxed);
      });
      auto B = tf.emplace([&] () {
        counter.fetch_add(1, std::memory_order_relaxed);
      });
      A.precede(B);
    }
  };

  SUBCASE("RunAndWait") {
    tf::Executor executor(w);
    counter = 0;
    for(int t=0; t<32; t++) {
      threads.emplace_back([&] () {
        tf::Taskflow taskflow;
        make_taskflow(taskflow);
        executor.run(taskflow).wait();
      });
    }

    for(auto& t : threads) {
      t.join();
    }
    threads.clear();

    REQUIRE(counter.load() == 32*1024*2);

  }

  SUBCASE("RunAndWaitForAll") {
    tf::Executor executor(w);
    counter = 0;
    std::vector<std::unique_ptr<tf::Taskflow>> taskflows(32);
    std::atomic<size_t> barrier(0);
    for(int t=0; t<32; t++) {
      threads.emplace_back([&, t=t] () {
        taskflows[t] = std::make_unique<tf::Taskflow>();
        make_taskflow(*taskflows[t]);
        executor.run(*taskflows[t]);
        ++barrier;    // make sure all runs are issued
      });
    }

    while(barrier != 32);
    executor.wait_for_all();
    REQUIRE(counter.load() == 32*1024*2);

    for(auto& t : threads) {
      t.join();
    }
    threads.clear();
  }
}